

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairTools.cpp
# Opt level: O1

void __thiscall
wirehair::PeelRowParameters::Initialize
          (PeelRowParameters *this,uint32_t row_seed,uint32_t p_seed,uint16_t peel_column_count,
          uint16_t mix_column_count)

{
  long lVar1;
  ulong uVar2;
  byte bVar3;
  ushort uVar4;
  uint uVar5;
  ushort uVar6;
  ulong uVar7;
  
  lVar1 = (ulong)row_seed * 2 + 1;
  uVar2 = ((ulong)p_seed + 1) * 0x5851f42d4c957f2d + (ulong)row_seed * -0x4f5c17a566d501a4 + 1;
  uVar5 = (uint)(uVar2 >> 0x2d) ^ (uint)(uVar2 >> 0x1b);
  bVar3 = (byte)(uVar2 >> 0x3b);
  uVar5 = uVar5 >> bVar3 | uVar5 << 0x20 - bVar3;
  if (peel_column_count < 0x801) {
    uVar4 = 1;
    if (uVar5 < 0x1ffffff) goto LAB_00108d1e;
    uVar5 = uVar5 + 0xfe000001;
  }
  uVar4 = 2;
  if (((int)uVar5 < 0) && (uVar4 = 3, 0xaaaaaaa9 < uVar5)) {
    uVar6 = 3;
    do {
      uVar4 = uVar6 + 1;
      uVar7 = (ulong)uVar6;
      uVar6 = uVar4;
    } while (*(uint *)(kPeelCountDistribution + uVar7 * 4) < uVar5);
  }
LAB_00108d1e:
  uVar2 = uVar2 * 0x5851f42d4c957f2d + lVar1;
  if (peel_column_count >> 1 <= uVar4) {
    uVar4 = peel_column_count >> 1;
  }
  this->PeelCount = uVar4;
  uVar5 = (uint)(uVar2 >> 0x2d) ^ (uint)(uVar2 >> 0x1b);
  bVar3 = (byte)(uVar2 >> 0x3b);
  uVar5 = uVar5 >> bVar3 | uVar5 << 0x20 - bVar3;
  uVar2 = uVar2 * 0x5851f42d4c957f2d + lVar1;
  this->PeelAdd =
       (short)((long)((ulong)uVar5 & 0xffffffff0000ffff) % (long)(int)(peel_column_count - 1)) + 1;
  this->PeelFirst = (uint16_t)((uVar5 >> 0x10) % (uint)peel_column_count);
  uVar5 = (uint)(uVar2 >> 0x2d) ^ (uint)(uVar2 >> 0x1b);
  bVar3 = (byte)(uVar2 >> 0x3b);
  uVar5 = uVar5 >> bVar3 | uVar5 << 0x20 - bVar3;
  this->MixAdd = (short)((long)(ulong)(uVar5 & 0xffff) % (long)(int)(mix_column_count - 1)) + 1;
  this->MixFirst = (uint16_t)((uVar5 >> 0x10) % (uint)mix_column_count);
  return;
}

Assistant:

void PeelRowParameters::Initialize(
    uint32_t row_seed,
    uint32_t p_seed,
    uint16_t peel_column_count,
    uint16_t mix_column_count)
{
    // Initialize PRNG
    PCGRandom prng;
    prng.Seed(row_seed, p_seed);

    // Generate peeling matrix row weight
    const uint16_t weight = GeneratePeelRowWeight(prng.Next(), peel_column_count);

    // Do not set more than N/2 at a time
    const uint16_t max_weight = peel_column_count / 2;

    PeelCount = (weight > max_weight) ? max_weight : weight;

    CAT_DEBUG_ASSERT(PeelCount > 0 && PeelCount <= kMaxPeelCount);

    const uint32_t rv_peel = prng.Next();

    // Generate peeling matrix column selection parameters for row
    PeelAdd = ((uint16_t)rv_peel % (peel_column_count - 1)) + 1;
    PeelFirst = (uint16_t)(rv_peel >> 16) % peel_column_count;

    const uint32_t rv_mix = prng.Next();

    // Generate mixing matrix column selection parameters
    MixAdd = ((uint16_t)rv_mix % (mix_column_count - 1)) + 1;
    MixFirst = (uint16_t)(rv_mix >> 16) % mix_column_count;
}